

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O0

DWORD GetFullPathNameA(LPCSTR lpFileName,DWORD nBufferLength,LPSTR lpBuffer,LPSTR *lpFilePart)

{
  uint uVar1;
  bool bVar2;
  FILE *__stream;
  DWORD DVar3;
  errno_t eVar4;
  int *piVar5;
  size_t szSize;
  size_t sVar6;
  char *pcVar7;
  size_t max_len;
  char *pcStack_38;
  BOOL fullPath;
  LPSTR lpUnixPath;
  DWORD nRet;
  DWORD nReqPathLen;
  LPSTR *lpFilePart_local;
  LPSTR lpBuffer_local;
  DWORD nBufferLength_local;
  LPCSTR lpFileName_local;
  
  lpUnixPath._0_4_ = 0;
  pcStack_38 = (char *)0x0;
  bVar2 = false;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (lpFileName == (LPCSTR)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    SetLastError(0x57);
    goto LAB_00144164;
  }
  if ((*lpFileName == '\\') || (*lpFileName == '/')) {
    bVar2 = true;
  }
  if (bVar2) {
    pcStack_38 = PAL__strdup(lpFileName);
    if (pcStack_38 == (char *)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      piVar5 = __errno_location();
      strerror(*piVar5);
      SetLastError(8);
      goto LAB_00144164;
    }
  }
  else {
    sVar6 = strlen(lpFileName);
    szSize = sVar6 + 0x402;
    pcStack_38 = (char *)PAL_malloc(szSize);
    if (pcStack_38 == (LPSTR)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      piVar5 = __errno_location();
      strerror(*piVar5);
      SetLastError(8);
      goto LAB_00144164;
    }
    DVar3 = GetCurrentDirectoryA(0x401,pcStack_38);
    if (DVar3 == 0) {
      fprintf(_stderr,"] %s %s:%d","GetFullPathNameA",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
              ,0x74);
      __stream = _stderr;
      DVar3 = GetLastError();
      fprintf(__stream,"GetCurrentDirectoryA() failed! lasterror is %#xd\n",(ulong)DVar3);
      SetLastError(0x54f);
      goto LAB_00144164;
    }
    eVar4 = strcat_s(pcStack_38,szSize,"/");
    if (eVar4 != 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      SetLastError(0xce);
      goto LAB_00144164;
    }
    eVar4 = strcat_s(pcStack_38,szSize,lpFileName);
    if (eVar4 != 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      SetLastError(0xce);
      goto LAB_00144164;
    }
  }
  FILEDosToUnixPathA(pcStack_38);
  FILECanonicalizePath(pcStack_38);
  sVar6 = strlen(pcStack_38);
  uVar1 = (uint)sVar6;
  lpUnixPath._0_4_ = uVar1 + 1;
  if (nBufferLength < (uint)lpUnixPath) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
  }
  else {
    strcpy_s(lpBuffer,(ulong)nBufferLength,pcStack_38);
    lpUnixPath._0_4_ = uVar1;
    if (lpFilePart != (LPSTR *)0x0) {
      pcVar7 = strrchr(lpBuffer,0x2f);
      *lpFilePart = pcVar7;
      if (*lpFilePart == (LPSTR)0x0) {
        fprintf(_stderr,"] %s %s:%d","GetFullPathNameA",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
                ,0xa3);
        fprintf(_stderr,"Not able to find \'/\' in the full path.\n");
        SetLastError(0x54f);
        lpUnixPath._0_4_ = 0;
      }
      else {
        *lpFilePart = *lpFilePart + 1;
      }
    }
  }
LAB_00144164:
  PAL_free(pcStack_38);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return (uint)lpUnixPath;
}

Assistant:

DWORD
PALAPI
GetFullPathNameA(
     IN LPCSTR lpFileName,
     IN DWORD nBufferLength,
     OUT LPSTR lpBuffer,
     OUT LPSTR *lpFilePart)
{
    DWORD  nReqPathLen, nRet = 0;
    LPSTR lpUnixPath = NULL;
    BOOL fullPath = FALSE;

    PERF_ENTRY(GetFullPathNameA);
    ENTRY("GetFullPathNameA(lpFileName=%p (%s), nBufferLength=%u, lpBuffer=%p, "
          "lpFilePart=%p)\n",
          lpFileName?lpFileName:"NULL",
          lpFileName?lpFileName:"NULL", nBufferLength, lpBuffer, lpFilePart);

    if(NULL == lpFileName)
    {
        WARN("lpFileName is NULL\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    /* find out if lpFileName is a partial or full path */
    if ('\\' == *lpFileName || '/' == *lpFileName)
    {
        fullPath = TRUE;
    }

    if(fullPath)
    {
        lpUnixPath = PAL__strdup( lpFileName );
        if(NULL == lpUnixPath)
        {
            ERROR("strdup() failed; error is %d (%s)\n",
                  errno, strerror(errno));
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
    }
    else
    {
        size_t max_len;

        /* allocate memory for full non-canonical path */
        max_len = strlen(lpFileName)+1; /* 1 for the slash to append */
        max_len += MAX_LONGPATH + 1;
        lpUnixPath = (LPSTR)PAL_malloc(max_len);
        if(NULL == lpUnixPath)
        {
            ERROR("PAL_malloc() failed; error is %d (%s)\n",
                  errno, strerror(errno));
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }

        /* build full path */
        if(!GetCurrentDirectoryA(MAX_LONGPATH + 1, lpUnixPath))
        {
            /* no reason for this to fail now... */
            ASSERT("GetCurrentDirectoryA() failed! lasterror is %#xd\n",
                   GetLastError());
            SetLastError(ERROR_INTERNAL_ERROR);
            goto done;
        }

        if (strcat_s(lpUnixPath, max_len, "/") != SAFECRT_SUCCESS)
        {
            ERROR("strcat_s failed!\n");
            SetLastError(ERROR_FILENAME_EXCED_RANGE);
            goto done;
        }

        if (strcat_s(lpUnixPath, max_len, lpFileName) != SAFECRT_SUCCESS)
        {
            ERROR("strcat_s failed!\n");
            SetLastError(ERROR_FILENAME_EXCED_RANGE);
            goto done;
        }
    }

    /* do conversion to Unix path */
    FILEDosToUnixPathA( lpUnixPath );

    /* now we can canonicalize this */
    FILECanonicalizePath(lpUnixPath);

    /* at last, we can figure out how long this path is */
    nReqPathLen = strlen(lpUnixPath)+1;

    if(nBufferLength < nReqPathLen)
    {
        TRACE("reporting insufficient buffer : minimum is %d, caller "
              "provided %d\n", nReqPathLen, nBufferLength);
        nRet = nReqPathLen;
        goto done;
    }

    nRet = nReqPathLen-1;
    strcpy_s(lpBuffer, nBufferLength, lpUnixPath);

    /* locate the filename component if caller cares */
    if(lpFilePart)
    {
        *lpFilePart = strrchr(lpBuffer, '/');

        if (*lpFilePart == NULL)
        {
            ASSERT("Not able to find '/' in the full path.\n");
            SetLastError( ERROR_INTERNAL_ERROR );
            nRet = 0;
            goto done;
        }
        else
        {
            (*lpFilePart)++;
        }
    }

done:
    PAL_free (lpUnixPath);
    LOGEXIT("GetFullPathNameA returns DWORD %u\n", nRet);
    PERF_EXIT(GetFullPathNameA);
    return nRet;
}